

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

type * __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
as<(anonymous_namespace)::ns::Project<std::vector<(anonymous_namespace)::ns::Value,std::allocator<(anonymous_namespace)::ns::Value>>>>
          (type *__return_storage_ptr__,
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this)

{
  bool bVar1;
  int iVar2;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar3;
  type *ptVar4;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_00;
  _Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
  *this_01;
  pointer pVVar5;
  iterator this_02;
  type *extraout_RAX;
  system_error *psVar6;
  uint uVar7;
  string_view_type *key;
  pointer pVVar8;
  pointer pVVar9;
  const_array_range_type cVar10;
  error_code __ec;
  error_code __ec_00;
  type local_88;
  vector<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
  local_58;
  string_view_type local_40;
  undefined7 extraout_var;
  
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
  if (!bVar1) {
    psVar6 = (system_error *)__cxa_allocate_exception(0x58);
    std::error_code::error_code<jsoncons::conv_errc,void>((error_code *)&local_58,conversion_failed)
    ;
    local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Not a ns::Project","");
    __ec_00._4_4_ = 0;
    __ec_00._M_value =
         (uint)local_58.
               super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
               ._M_impl.super__Vector_impl_data._M_start;
    *(undefined ***)(psVar6 + 0x50) = &PTR__json_exception_00b2f248;
    __ec_00._M_cat =
         (error_category *)
         local_58.
         super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    std::system_error::system_error(psVar6,__ec_00,&local_88.name);
    *(undefined8 *)psVar6 = 0xb31b78;
    *(undefined8 *)(psVar6 + 0x50) = 0xb31bb0;
    *(undefined1 (*) [16])(psVar6 + 0x20) = (undefined1  [16])0x0;
    *(system_error **)(psVar6 + 0x30) = psVar6 + 0x40;
    *(undefined8 *)(psVar6 + 0x38) = 0;
    psVar6[0x40] = (system_error)0x0;
    __cxa_throw(psVar6,&conv_error::typeinfo,conv_error::~conv_error);
  }
  __return_storage_ptr__->version = 1;
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->author)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->author).field_2;
  (__return_storage_ptr__->author)._M_string_length = 0;
  (__return_storage_ptr__->author).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->notes)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->notes).field_2;
  (__return_storage_ptr__->notes)._M_string_length = 0;
  (__return_storage_ptr__->notes).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->showNotes = false;
  (__return_storage_ptr__->values).
  super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->values).
  super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).
  super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.name._M_dataplus._M_p = (pointer)0x7;
  local_88.name._M_string_length = 0x8ceb1b;
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)&local_88);
  if (bVar1) {
    local_88.name._M_dataplus._M_p = (pointer)0x7;
    local_88.name._M_string_length = 0x8ceb1b;
    pbVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                       ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                        (string_view_type *)&local_88);
    iVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_integer<int>
                      (pbVar3);
    __return_storage_ptr__->version = iVar2;
  }
  local_88.name._M_dataplus._M_p = (pointer)0x4;
  local_88.name._M_string_length = 0x95412b;
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)&local_88);
  if (bVar1) {
    local_88.name._M_dataplus._M_p = (pointer)0x4;
    local_88.name._M_string_length = 0x95412b;
    json_traits_helper<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
    set_udt_member<std::__cxx11::string>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               (string_view_type *)&local_88,&__return_storage_ptr__->name);
  }
  local_88.name._M_dataplus._M_p = &DAT_00000006;
  local_88.name._M_string_length = 0x8dd19e;
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)&local_88);
  if (bVar1) {
    local_88.name._M_dataplus._M_p = &DAT_00000006;
    local_88.name._M_string_length = 0x8dd19e;
    json_traits_helper<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
    set_udt_member<std::__cxx11::string>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               (string_view_type *)&local_88,&__return_storage_ptr__->author);
  }
  local_88.name._M_dataplus._M_p = &DAT_00000005;
  local_88.name._M_string_length = 0x930556;
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)&local_88);
  if (bVar1) {
    local_88.name._M_dataplus._M_p = &DAT_00000005;
    local_88.name._M_string_length = 0x930556;
    json_traits_helper<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
    set_udt_member<std::__cxx11::string>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               (string_view_type *)&local_88,&__return_storage_ptr__->notes);
  }
  local_88.name._M_dataplus._M_p = (pointer)0x9;
  local_88.name._M_string_length = 0x93055c;
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)&local_88);
  if (bVar1) {
    local_88.name._M_dataplus._M_p = (pointer)0x9;
    local_88.name._M_string_length = 0x93055c;
    pbVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                       ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                        (string_view_type *)&local_88);
    bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_bool(pbVar3);
    __return_storage_ptr__->showNotes = bVar1;
  }
  local_88.name._M_dataplus._M_p = &DAT_00000006;
  local_88.name._M_string_length = 0x85ee7b;
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)&local_88);
  ptVar4 = (type *)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    key = &local_40;
    local_40._M_len = 6;
    local_40._M_str = "values";
    this_00 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                         key);
    pbVar3 = this_00;
    while (uVar7 = *(byte *)&pbVar3->field_0 & 0xf, uVar7 - 8 < 2) {
      pbVar3 = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
                ((long)&pbVar3->field_0 + 8);
    }
    if (uVar7 != 0xe) {
      psVar6 = (system_error *)__cxa_allocate_exception(0x58);
      std::error_code::error_code<jsoncons::conv_errc,void>((error_code *)&local_88,not_vector);
      __ec._0_8_ = (ulong)local_88.name._M_dataplus._M_p & 0xffffffff;
      *(undefined ***)(psVar6 + 0x50) = &PTR__json_exception_00b2f248;
      __ec._M_cat = (error_category *)local_88.name._M_string_length;
      std::system_error::system_error(psVar6,__ec);
      *(undefined8 *)psVar6 = 0xb31b78;
      *(undefined8 *)(psVar6 + 0x50) = 0xb31bb0;
      *(undefined1 (*) [16])(psVar6 + 0x20) = (undefined1  [16])0x0;
      *(system_error **)(psVar6 + 0x30) = psVar6 + 0x40;
      *(undefined8 *)(psVar6 + 0x38) = 0;
      psVar6[0x40] = (system_error)0x0;
      __cxa_throw(psVar6,&conv_error::typeinfo,conv_error::~conv_error);
    }
    local_58.
    super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ._M_impl.super__Vector_impl_data._0_16_ = (error_code)0x0;
    local_58.
    super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_01 = (_Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
               *)basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(this_00);
    if ((_Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
         *)0x333333333333333 < this_01) {
      std::__throw_length_error("vector::reserve");
    }
    if (this_01 ==
        (_Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
         *)0x0) {
      pVVar8 = (pointer)0x0;
      pVVar5 = (pointer)0x0;
    }
    else {
      pVVar5 = std::
               _Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
               ::_M_allocate(this_01,(size_t)key);
      local_58.
      super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
      ._M_impl.super__Vector_impl_data._M_finish = pVVar5;
      local_58.
      super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
      ._M_impl.super__Vector_impl_data._M_start = pVVar5;
      pVVar8 = pVVar5 + (long)this_01;
      local_58.
      super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pVVar8;
    }
    cVar10 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range(this_00);
    this_02 = cVar10.first_._M_current;
    pVVar9 = pVVar5;
    if (this_02._M_current != cVar10.last_._M_current._M_current) {
      do {
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
        as<(anonymous_namespace)::ns::Value>(&local_88,this_02._M_current);
        std::
        vector<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
        ::push_back(&local_58,&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88.name._M_dataplus._M_p != &local_88.name.field_2) {
          operator_delete(local_88.name._M_dataplus._M_p,
                          local_88.name.field_2._M_allocated_capacity + 1);
        }
        this_02._M_current = this_02._M_current + 1;
      } while (this_02._M_current != cVar10.last_._M_current._M_current);
      pVVar5 = local_58.
               super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar9 = local_58.
               super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pVVar8 = local_58.
               super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    local_88.name.field_2._M_allocated_capacity =
         (size_type)
         (__return_storage_ptr__->values).
         super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_88.name._M_dataplus._M_p =
         (pointer)(__return_storage_ptr__->values).
                  super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_88.name._M_string_length =
         (size_type)
         (__return_storage_ptr__->values).
         super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->values).
    super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ._M_impl.super__Vector_impl_data._M_start = pVVar5;
    (__return_storage_ptr__->values).
    super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ._M_impl.super__Vector_impl_data._M_finish = pVVar9;
    (__return_storage_ptr__->values).
    super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pVVar8;
    local_58.
    super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ._M_impl.super__Vector_impl_data._0_16_ = (error_code)0x0;
    local_58.
    super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ::~vector((vector<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
               *)&local_88);
    std::vector<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ::~vector(&local_58);
    ptVar4 = extraout_RAX;
  }
  return ptVar4;
}

Assistant:

typename std::enable_if<is_json_type_traits_specialized<basic_json,T>::value,T>::type
        as() const
        {
            T val = json_type_traits<basic_json,T>::as(*this);
            return val;
        }